

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::VertexFeedbackOverflowCase::init
          (VertexFeedbackOverflowCase *this,EVP_PKEY_CTX *ctx)

{
  undefined8 *puVar1;
  ostringstream *poVar2;
  RenderContext *renderCtx;
  _Alloc_hider _Var3;
  size_type sVar4;
  bool bVar5;
  ContextType ctxType;
  int iVar6;
  deUint32 dVar7;
  int extraout_EAX;
  undefined4 extraout_var;
  ObjectWrapper *this_00;
  undefined4 extraout_var_00;
  ObjectTraits *traits;
  void *pvVar8;
  long lVar9;
  ShaderProgram *this_01;
  pointer pcVar10;
  TestError *this_02;
  NotSupportedError *this_03;
  ios_base *this_04;
  long lVar11;
  size_type __dnew_1;
  size_type __dnew;
  string local_2c8;
  string local_2a8;
  value_type local_288;
  size_type local_268;
  value_type local_260;
  ContextType local_240;
  ContextType local_23c;
  uint local_238;
  value_type local_230;
  string local_210;
  string local_1f0;
  undefined7 *local_1d0;
  undefined8 local_1c8;
  undefined7 local_1c0;
  undefined4 uStack_1b9;
  undefined1 local_1b5;
  undefined1 local_1b0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0 [3];
  ios_base local_138 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_120;
  deUint32 local_108;
  undefined1 local_100 [208];
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar5 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar5) {
    bVar5 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,"GL_EXT_geometry_shader");
    if (!bVar5) {
      this_03 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_03,"Tests require GL_EXT_geometry_shader extension or higher context version."
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                 ,0x16b4);
      __cxa_throw(this_03,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,
             "Testing GL_EXT_geometry_shader transform feedback overflow behavior.\n",0x45);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,
             "Capturing vertex shader varying, rendering 2 triangles. Allocating feedback buffer for 5 vertices."
             ,0x62);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  this_04 = local_138;
  std::ios_base::~ios_base(this_04);
  if (Functional::(anonymous_namespace)::VertexFeedbackOverflowCase::init()::arrayData == '\0') {
    _GLOBAL__N_1::VertexFeedbackOverflowCase::init((EVP_PKEY_CTX *)this_04);
  }
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar11 = CONCAT44(extraout_var,iVar6);
  this_00 = (ObjectWrapper *)operator_new(0x18);
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  traits = glu::objectTraits(OBJECTTYPE_VERTEX_ARRAY);
  glu::ObjectWrapper::ObjectWrapper(this_00,(Functions *)CONCAT44(extraout_var_00,iVar6),traits);
  this->m_vao = (VertexArray *)this_00;
  (**(code **)(lVar11 + 0xd8))(this_00->m_object);
  dVar7 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar7,"set up vao",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x16d2);
  if (this->m_method == METHOD_DRAW_ELEMENTS) {
    (**(code **)(lVar11 + 0x6c8))(1,&this->m_elementBuf);
    (**(code **)(lVar11 + 0x40))(0x8893,this->m_elementBuf);
    (**(code **)(lVar11 + 0x150))(0x8893,0xc,init::elementData,0x88e4);
    dVar7 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar7,"gen buf",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                    ,0x16d9);
  }
  (**(code **)(lVar11 + 0x6c8))(1,&this->m_arrayBuf);
  (**(code **)(lVar11 + 0x40))(0x8892,this->m_arrayBuf);
  (**(code **)(lVar11 + 0x150))(0x8892,0x40,init::arrayData,0x88e4);
  dVar7 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar7,"gen buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x16df);
  pvVar8 = operator_new(0x50);
  lVar9 = 0;
  do {
    puVar1 = (undefined8 *)((long)pvVar8 + lVar9 * 4);
    *puVar1 = 0xbf800000bf800000;
    puVar1[1] = 0xbf800000bf800000;
    lVar9 = lVar9 + 4;
  } while (lVar9 != 0x14);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"Filling feeback buffer with dummy value (-1.0).",0x2f);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_138);
  (**(code **)(lVar11 + 0x6c8))(1,&this->m_feedbackBuf);
  (**(code **)(lVar11 + 0x40))(0x8c8e,this->m_feedbackBuf);
  (**(code **)(lVar11 + 0x150))(0x8c8e,0x50,pvVar8,0x88ea);
  dVar7 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar7,"gen buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x16ea);
  operator_delete(pvVar8,0x50);
  this_01 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(local_1b0,0,0xac);
  local_100._0_8_ = (pointer)0x0;
  local_100[8] = 0;
  local_100._9_7_ = 0;
  local_100[0x10] = 0;
  local_100._17_8_ = 0;
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  local_268 = 0x5f;
  pcVar10 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_2c8,(ulong)&local_268);
  sVar4 = local_268;
  local_2c8.field_2._M_allocated_capacity = local_268;
  local_2c8._M_dataplus._M_p = pcVar10;
  memcpy(pcVar10,
         "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
         ,0x5f);
  local_2c8._M_string_length = sVar4;
  pcVar10[sVar4] = '\0';
  local_23c.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  specializeShader(&local_1f0,&local_2c8,&local_23c);
  local_238 = 0;
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_230,local_1f0._M_dataplus._M_p,
             local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b0 + (ulong)local_238 * 0x18),&local_230);
  local_288._M_dataplus._M_p = (pointer)0x73;
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  pcVar10 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_2a8,(ulong)&local_288);
  _Var3._M_p = local_288._M_dataplus._M_p;
  local_2a8.field_2._M_allocated_capacity = (size_type)local_288._M_dataplus._M_p;
  local_2a8._M_dataplus._M_p = pcVar10;
  memcpy(pcVar10,
         "${GLSL_VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = vec4(1.0);\n}\n"
         ,0x73);
  local_2a8._M_string_length = (size_type)_Var3._M_p;
  pcVar10[_Var3._M_p] = '\0';
  local_240.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  specializeShader(&local_210,&local_2a8,&local_240);
  local_268 = CONCAT44(local_268._4_4_,1);
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_260,local_210._M_dataplus._M_p,
             local_210._M_dataplus._M_p + local_210._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b0 + (local_268 & 0xffffffff) * 0x18),&local_260);
  local_1c0 = 0x69736f505f6c67;
  uStack_1b9 = 0x6e6f6974;
  local_1c8 = 0xb;
  local_1b5 = 0;
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  local_1d0 = &local_1c0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_288,&local_1c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_100,&local_288);
  local_108 = 0x8c8c;
  glu::ShaderProgram::ShaderProgram(this_01,renderCtx,(ProgramSources *)local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,CONCAT17((undefined1)uStack_1b9,local_1c0) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,(ulong)(local_2a8.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_100);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_120);
  lVar11 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b0 + lVar11));
    lVar11 = lVar11 + -0x18;
  } while (lVar11 != -0x18);
  this->m_program = this_01;
  if ((this_01->m_program).m_info.linkOk != false) {
    return extraout_EAX;
  }
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,this_01);
  this_02 = (TestError *)__cxa_allocate_exception(0x38);
  local_1b0._0_8_ = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"could not build program","");
  tcu::TestError::TestError(this_02,(string *)local_1b0);
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void VertexFeedbackOverflowCase::init (void)
{
	// requirements

	if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)) && !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader"))
		TCU_THROW(NotSupportedError, "Tests require GL_EXT_geometry_shader extension or higher context version.");

	// log what test tries to do

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Testing GL_EXT_geometry_shader transform feedback overflow behavior.\n"
		<< "Capturing vertex shader varying, rendering 2 triangles. Allocating feedback buffer for 5 vertices."
		<< tcu::TestLog::EndMessage;

	// resources

	{
		static const deUint16	elementData[] =
		{
			0, 1, 2,
			0, 1, 2,
		};
		static const tcu::Vec4	arrayData[] =
		{
			tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
			tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
			tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
			tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
		};

		const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();

		m_vao = new glu::VertexArray(m_context.getRenderContext());
		gl.bindVertexArray(**m_vao);
		GLU_EXPECT_NO_ERROR(gl.getError(), "set up vao");

		if (m_method == METHOD_DRAW_ELEMENTS)
		{
			gl.genBuffers(1, &m_elementBuf);
			gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_elementBuf);
			gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(elementData), &elementData[0], GL_STATIC_DRAW);
			GLU_EXPECT_NO_ERROR(gl.getError(), "gen buf");
		}

		gl.genBuffers(1, &m_arrayBuf);
		gl.bindBuffer(GL_ARRAY_BUFFER, m_arrayBuf);
		gl.bufferData(GL_ARRAY_BUFFER, sizeof(arrayData), &arrayData[0], GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen buf");

		{
			const int					feedbackCount			= 5 * 4; // 5x vec4
			const std::vector<float>	initialBufferContents	(feedbackCount, -1.0f);

			m_testCtx.getLog() << tcu::TestLog::Message << "Filling feeback buffer with dummy value (-1.0)." << tcu::TestLog::EndMessage;

			gl.genBuffers(1, &m_feedbackBuf);
			gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_feedbackBuf);
			gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, (int)(sizeof(float) * initialBufferContents.size()), &initialBufferContents[0], GL_DYNAMIC_COPY);
			GLU_EXPECT_NO_ERROR(gl.getError(), "gen buf");
		}

		m_program = genProgram();

		if (!m_program->isOk())
		{
			m_testCtx.getLog() << *m_program;
			throw tcu::TestError("could not build program");
		}
	}
}